

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.hpp
# Opt level: O3

bool udpdiscovery::impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
               (SerializeDirection direction,uint *value,BufferView *buffer_view)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = true;
  if (direction == kParse) {
    *value = 0;
    if ((int)buffer_view->buffer_->_M_string_length < buffer_view->parsed_ + 4) {
      bVar2 = false;
    }
    else {
      iVar3 = 0x18;
      do {
        bVar1 = BufferView::Read(buffer_view);
        *value = *value | (uint)bVar1 << ((byte)iVar3 & 0x1f);
        iVar3 = iVar3 + -8;
      } while (iVar3 != -8);
    }
  }
  else if (direction == kSerialize) {
    iVar3 = -4;
    do {
      std::__cxx11::string::push_back((char)buffer_view->buffer_);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0);
  }
  return bVar2;
}

Assistant:

bool SerializeUnsignedIntegerBigEndian(SerializeDirection direction,
                                       ValueType* value,
                                       BufferView* buffer_view) {
  switch (direction) {
    case kSerialize: {
      int n = sizeof(ValueType);
      for (int i = 0; i < n; ++i) {
        uint8_t c = (uint8_t)((*value) >> ((n - i - 1) * 8)) & 0xff;
        buffer_view->push_back(c);
      }
    } break;

    case kParse:
      *value = 0;
      if (buffer_view->CanRead(sizeof(ValueType))) {
        int n = sizeof(ValueType);
        for (int i = 0; i < n; ++i) {
          ValueType v = (uint8_t)buffer_view->Read();
          *value |= (v << ((n - i - 1) * 8));
        }
      } else {
        return false;
      }
      break;
  }

  return true;
}